

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_search.c
# Opt level: O0

void fsg_search_word_trans(fsg_search_t *fsgs)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int32 iVar5;
  int frame;
  int score_00;
  fsg_hist_entry_t *pfVar6;
  glist_t pgVar7;
  int local_54;
  int32 rc;
  int32 lc;
  fsg_pnode_t *root;
  int32 d;
  int32 nf;
  int32 thresh;
  int32 newscore;
  int32 score;
  fsg_link_t *l;
  fsg_hist_entry_t *hist_entry;
  int32 n_entries;
  int32 bpidx;
  fsg_search_t *fsgs_local;
  
  iVar5 = fsg_history_n_entries(fsgs->history);
  iVar2 = fsgs->bestscore;
  iVar3 = fsgs->beam;
  frame = fsgs->frame + 1;
  hist_entry._4_4_ = fsgs->bpidx_start;
  while( true ) {
    if (iVar5 <= hist_entry._4_4_) {
      return;
    }
    pfVar6 = fsg_history_entry_get(fsgs->history,hist_entry._4_4_);
    if (pfVar6 == (fsg_hist_entry_t *)0x0) break;
    iVar4 = pfVar6->score;
    if (fsgs->frame != pfVar6->frame) {
      __assert_fail("fsgs->frame == fsg_hist_entry_frame(hist_entry)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                    ,0x27b,"void fsg_search_word_trans(fsg_search_t *)");
    }
    if (pfVar6->fsglink == (fsg_link_t *)0x0) {
      local_54 = fsgs->fsg->start_state;
    }
    else {
      local_54 = pfVar6->fsglink->to_state;
    }
    sVar1 = pfVar6->lc;
    for (_rc = fsgs->lextree->root[local_54]; _rc != (fsg_pnode_t *)0x0; _rc = _rc->sibling) {
      if ((((((_rc->ctxt).bv[(int)sVar1 >> 5] & 1 << ((byte)sVar1 & 0x1f)) != 0) &&
           (((pfVar6->rc).bv[(int)(uint)_rc->ci_ext >> 5] & 1 << ((byte)_rc->ci_ext & 0x1f)) != 0))
          && (score_00 = iVar4 + _rc->logs2prob, iVar2 + iVar3 < score_00)) &&
         ((_rc->hmm).score[0] < score_00)) {
        if ((_rc->hmm).frame < frame) {
          pgVar7 = glist_add_ptr(fsgs->pnode_active_next,_rc);
          fsgs->pnode_active_next = pgVar7;
        }
        hmm_enter(&_rc->hmm,score_00,hist_entry._4_4_,frame);
      }
    }
    hist_entry._4_4_ = hist_entry._4_4_ + 1;
  }
  __assert_fail("hist_entry",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                ,0x279,"void fsg_search_word_trans(fsg_search_t *)");
}

Assistant:

static void
fsg_search_word_trans(fsg_search_t *fsgs)
{
    int32 bpidx, n_entries;
    fsg_hist_entry_t *hist_entry;
    fsg_link_t *l;
    int32 score, newscore, thresh, nf, d;
    fsg_pnode_t *root;
    int32 lc, rc;

    n_entries = fsg_history_n_entries(fsgs->history);

    thresh = fsgs->bestscore + fsgs->beam;
    nf = fsgs->frame + 1;

    for (bpidx = fsgs->bpidx_start; bpidx < n_entries; bpidx++) {
        hist_entry = fsg_history_entry_get(fsgs->history, bpidx);
        assert(hist_entry);
        score = fsg_hist_entry_score(hist_entry);
        assert(fsgs->frame == fsg_hist_entry_frame(hist_entry));

        l = fsg_hist_entry_fsglink(hist_entry);

        /* Destination state for hist_entry */
        d = l ? fsg_link_to_state(l) : fsg_model_start_state(fsgs->
                                                                fsg);

        lc = fsg_hist_entry_lc(hist_entry);

        /* Transition to all root nodes attached to state d */
        for (root = fsg_lextree_root(fsgs->lextree, d);
             root; root = root->sibling) {
            rc = root->ci_ext;

            if ((root->ctxt.bv[lc >> 5] & (1 << (lc & 0x001f))) &&
                (hist_entry->rc.bv[rc >> 5] & (1 << (rc & 0x001f)))) {
                /*
                 * Last CIphone of history entry is in left-context list supported by
                 * target root node, and
                 * first CIphone of target root node is in right context list supported
                 * by history entry;
                 * So the transition can go ahead (if new score is good enough).
                 */
                newscore = score + root->logs2prob;

                if ((newscore BETTER_THAN thresh)
                    && (newscore BETTER_THAN hmm_in_score(&root->hmm))) {
                    if (hmm_frame(&root->hmm) < nf) {
                        /* Newly activated node; add to active list */
                        fsgs->pnode_active_next =
                            glist_add_ptr(fsgs->pnode_active_next,
                                          (void *) root);
#if __FSG_DBG__
                        E_INFO
                            ("[%5d] WordTrans bpidx[%d] -> pnode[%08x] (activated)\n",
                             fsgs->frame, bpidx, (int32) root);
#endif
                    }
                    else {
#if __FSG_DBG__
                        E_INFO
                            ("[%5d] WordTrans bpidx[%d] -> pnode[%08x]\n",
                             fsgs->frame, bpidx, (int32) root);
#endif
                    }

                    hmm_enter(&root->hmm, newscore, bpidx, nf);
                }
            }
        }
    }
}